

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O2

FormulaUnit * Shell::Flattening::flatten(FormulaUnit *unit)

{
  Formula *f;
  Formula *f_00;
  FormulaUnit *this;
  ostream *poVar1;
  Inference local_60;
  FormulaClauseTransformation local_30;
  
  f = unit->_formula;
  f_00 = flatten(f);
  this = unit;
  if (f != f_00) {
    this = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
    local_30.rule = FLATTEN;
    local_30.premise = &unit->super_Unit;
    Kernel::Inference::Inference(&local_60,&local_30);
    Kernel::FormulaUnit::FormulaUnit(this,f_00,&local_60);
    if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa1d2) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)&std::cout,"[PP] flatten in: ");
      Kernel::FormulaUnit::toString_abi_cxx11_((string *)&local_60,unit);
      poVar1 = std::operator<<(poVar1,(string *)&local_60);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_60);
      poVar1 = std::operator<<((ostream *)&std::cout,"[PP] flatten out: ");
      Kernel::FormulaUnit::toString_abi_cxx11_((string *)&local_60,this);
      poVar1 = std::operator<<(poVar1,(string *)&local_60);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return this;
}

Assistant:

FormulaUnit* Flattening::flatten (FormulaUnit* unit)
{
  ASS(! unit->isClause());

  Formula* f = unit->formula();
  Formula* g = flatten(f);
  if (f == g) { // not changed
    return unit;
  }

  FormulaUnit* res = new FormulaUnit(g,
      FormulaClauseTransformation(InferenceRule::FLATTEN,unit));
  if (env.options->showPreprocessing()) {
    std::cout << "[PP] flatten in: " << unit->toString() << std::endl;
    std::cout << "[PP] flatten out: " << res->toString() << std::endl;
  }
  return res;
}